

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O1

GLuint gl4cts::StencilTexturing::Utils::createAndBuildProgram
                 (Context *context,GLchar *cs_code,GLchar *fs_code,GLchar *gs_code,GLchar *tcs_code,
                 GLchar *tes_code,GLchar *vs_code)

{
  ostringstream *poVar1;
  GLuint GVar2;
  GLchar *code;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  GLuint j_1;
  GLuint i;
  GLuint j;
  long lVar6;
  long lVar7;
  GLuint shader_ids [6];
  string message;
  GLchar *shader_sources [6];
  int local_22c;
  GLuint local_228 [6];
  char *local_210;
  long local_208;
  char local_200;
  undefined7 uStack_1ff;
  GLchar *local_1f0;
  GLchar *local_1e8 [7];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1f0 = tes_code;
  iVar3 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  local_228[0] = 0;
  local_228[1] = 0;
  local_228[2] = 0;
  local_228[3] = 0;
  local_228[4] = 0;
  local_228[5] = 0;
  local_1e8[0] = cs_code;
  local_1e8[1] = fs_code;
  local_1e8[2] = gs_code;
  local_1e8[3] = tcs_code;
  local_1e8[4] = local_1f0;
  local_1e8[5] = vs_code;
  local_22c = 0;
  lVar7 = 0;
  do {
    code = *(GLchar **)((long)local_1e8 + lVar7 * 2);
    if (code != (GLchar *)0x0) {
      GVar4 = createAndCompileShader(context,*(GLenum *)((long)&DAT_01ad4550 + lVar7),code);
      *(GLuint *)((long)local_228 + lVar7) = GVar4;
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x18);
  lVar7 = 0;
LAB_009f4c07:
  if ((local_1e8[lVar7] == (GLchar *)0x0) || (local_228[lVar7] != 0)) goto LAB_009f4c1a;
  local_1b0._0_8_ = context->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Failed to build program due to compilation problems",0x33);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  lVar6 = 0;
  do {
    GVar4 = local_228[lVar6];
    iVar3 = (*context->m_renderCtx->_vptr_RenderContext[3])();
    if (GVar4 != 0) {
      (**(code **)(CONCAT44(extraout_var_02,iVar3) + 0x470))(GVar4);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  goto LAB_009f4ee6;
LAB_009f4c1a:
  lVar7 = lVar7 + 1;
  if (lVar7 == 6) {
    GVar4 = (**(code **)(lVar6 + 0x3c8))();
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"CreateProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                    ,0x7f);
    lVar7 = 0;
    do {
      if (local_228[lVar7] != 0) {
        (**(code **)(lVar6 + 0x10))(GVar4);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"AttachShader",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                        ,0x87);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 6);
    (**(code **)(lVar6 + 0xce8))(GVar4);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"LinkProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                    ,0x8d);
    lVar7 = 0;
    do {
      GVar2 = local_228[lVar7];
      iVar3 = (*context->m_renderCtx->_vptr_RenderContext[3])();
      if (GVar2 != 0) {
        (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x470))(GVar2);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 6);
    (**(code **)(lVar6 + 0x9d8))(GVar4,0x8b82,&local_22c);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"GetProgramiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                    ,0x97);
    if (local_22c != 1) {
      local_208 = 0;
      local_200 = '\0';
      local_210 = &local_200;
      (**(code **)(lVar6 + 0x9d8))(GVar4,0x8b84);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"GetProgramiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                      ,0xa1);
      std::__cxx11::string::resize((ulong)&local_210,'\0');
      (**(code **)(lVar6 + 0x988))(GVar4,0,0,local_210);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"GetProgramInfoLog",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                      ,0xa7);
      local_1b0._0_8_ = context->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Program linking failed: ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_210,local_208);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      iVar3 = (*context->m_renderCtx->_vptr_RenderContext[3])();
      if (GVar4 != 0) {
        (**(code **)(CONCAT44(extraout_var_01,iVar3) + 0x448))(GVar4);
      }
      if (local_210 != &local_200) {
        operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
      }
LAB_009f4ee6:
      GVar4 = 0;
    }
    return GVar4;
  }
  goto LAB_009f4c07;
}

Assistant:

GLuint Utils::createAndBuildProgram(deqp::Context& context, const GLchar* cs_code, const GLchar* fs_code,
									const GLchar* gs_code, const GLchar* tcs_code, const GLchar* tes_code,
									const GLchar* vs_code)
{
#define N_SHADER_STAGES 6

	const Functions& gl							 = context.getRenderContext().getFunctions();
	GLuint			 id							 = 0;
	GLuint			 shader_ids[N_SHADER_STAGES] = { 0 };

	const GLchar* shader_sources[N_SHADER_STAGES] = { cs_code, fs_code, gs_code, tcs_code, tes_code, vs_code };

	const GLenum shader_types[N_SHADER_STAGES] = { GL_COMPUTE_SHADER,		  GL_FRAGMENT_SHADER,
												   GL_GEOMETRY_SHADER,		  GL_TESS_CONTROL_SHADER,
												   GL_TESS_EVALUATION_SHADER, GL_VERTEX_SHADER };
	GLint status = GL_FALSE;

	/* Compile all shaders */
	try
	{
		for (GLuint i = 0; i < N_SHADER_STAGES; ++i)
		{
			if (0 != shader_sources[i])
			{
				shader_ids[i] = createAndCompileShader(context, shader_types[i], shader_sources[i]);
			}
		}

		/* Check compilation */
		for (GLuint i = 0; i < N_SHADER_STAGES; ++i)
		{
			if ((0 != shader_sources[i]) && (0 == shader_ids[i]))
			{
				context.getTestContext().getLog() << tcu::TestLog::Message
												  << "Failed to build program due to compilation problems"
												  << tcu::TestLog::EndMessage;

				/* Delete shaders */
				for (GLuint j = 0; j < N_SHADER_STAGES; ++j)
				{
					deleteShader(context, shader_ids[j]);
				}

				/* Done */
				return 0;
			}
		}

		/* Create program */
		id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateProgram");

		/* Attach shaders */
		for (GLuint i = 0; i < N_SHADER_STAGES; ++i)
		{
			if (0 != shader_ids[i])
			{
				gl.attachShader(id, shader_ids[i]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");
			}
		}

		/* Link program */
		gl.linkProgram(id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "LinkProgram");

		/* Clean shaders */
		for (GLuint j = 0; j < N_SHADER_STAGES; ++j)
		{
			deleteShader(context, shader_ids[j]);
		}

		/* Get link status */
		gl.getProgramiv(id, GL_LINK_STATUS, &status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

		/* Log link error */
		if (GL_TRUE != status)
		{
			glw::GLint  length = 0;
			std::string message;

			/* Get error log length */
			gl.getProgramiv(id, GL_INFO_LOG_LENGTH, &length);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

			message.resize(length, 0);

			/* Get error log */
			gl.getProgramInfoLog(id, length, 0, &message[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

			context.getTestContext().getLog() << tcu::TestLog::Message << "Program linking failed: " << message
											  << tcu::TestLog::EndMessage;

			/* Clean program */
			deleteProgram(context, id);

			/* Done */
			return 0;
		}
	}
	catch (std::exception& exc)
	{
		/* Delete shaders */
		for (GLuint j = 0; j < N_SHADER_STAGES; ++j)
		{
			deleteShader(context, shader_ids[j]);
		}

		throw exc;
	}

	return id;
}